

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatumSpecification.cpp
# Opt level: O1

bool __thiscall
DIS::DatumSpecification::operator==(DatumSpecification *this,DatumSpecification *rhs)

{
  bool bVar1;
  bool bVar2;
  pointer pFVar3;
  pointer pVVar4;
  long lVar5;
  ulong uVar6;
  
  pFVar3 = (this->_fixedDatumIDList).
           super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_fixedDatumIDList).
      super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
      super__Vector_impl_data._M_finish == pFVar3) {
    bVar2 = true;
  }
  else {
    bVar2 = true;
    lVar5 = 0;
    uVar6 = 0;
    do {
      bVar1 = FixedDatum::operator==
                        ((FixedDatum *)((long)&pFVar3->_vptr_FixedDatum + lVar5),
                         (FixedDatum *)
                         ((long)&((rhs->_fixedDatumIDList).
                                  super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_FixedDatum +
                         lVar5));
      if (!bVar1) {
        bVar2 = false;
      }
      uVar6 = uVar6 + 1;
      pFVar3 = (this->_fixedDatumIDList).
               super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x10;
    } while (uVar6 < (ulong)((long)(this->_fixedDatumIDList).
                                   super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar3 >> 4));
  }
  pVVar4 = (this->_variableDatumIDList).
           super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_variableDatumIDList).
      super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar4) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      bVar1 = VariableDatum::operator==
                        ((VariableDatum *)((long)&pVVar4->_vptr_VariableDatum + lVar5),
                         (VariableDatum *)
                         ((long)&((rhs->_variableDatumIDList).
                                  super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_VariableDatum +
                         lVar5));
      if (!bVar1) {
        bVar2 = false;
      }
      uVar6 = uVar6 + 1;
      pVVar4 = (this->_variableDatumIDList).
               super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x30;
    } while (uVar6 < (ulong)(((long)(this->_variableDatumIDList).
                                    super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar4 >> 4)
                            * -0x5555555555555555));
  }
  return bVar2;
}

Assistant:

bool DatumSpecification::operator ==(const DatumSpecification& rhs) const
 {
     bool ivarsEqual = true;


     for(size_t idx = 0; idx < _fixedDatumIDList.size(); idx++)
     {
        if( ! ( _fixedDatumIDList[idx] == rhs._fixedDatumIDList[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _variableDatumIDList.size(); idx++)
     {
        if( ! ( _variableDatumIDList[idx] == rhs._variableDatumIDList[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }